

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetFloatVerifier::verifyInteger4Mask
          (GetFloatVerifier *this,TestContext *testCtx,GLenum name,GLint reference0,bool enableRef0,
          GLint reference1,bool enableRef1,GLint reference2,bool enableRef2,GLint reference3,
          bool enableRef3)

{
  ostringstream *this_00;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  float fVar5;
  StateQueryMemoryWriteGuard<float[4]> floatVector4;
  MessageBuilder local_1b0;
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::StateQueryMemoryWriteGuard
            (&floatVector4);
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,floatVector4.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
                    (&floatVector4,testCtx);
  if (!bVar1) {
    return;
  }
  fVar5 = (float)reference0;
  if (enableRef0) {
    if ((floatVector4.m_value[0] != fVar5) || (NAN(floatVector4.m_value[0]) || NAN(fVar5)))
    goto LAB_006272ad;
  }
  if (enableRef1) {
    if ((floatVector4.m_value[1] != (float)reference1) ||
       (NAN(floatVector4.m_value[1]) || NAN((float)reference1))) goto LAB_006272ad;
  }
  if (enableRef2) {
    if ((floatVector4.m_value[2] != (float)reference2) ||
       (NAN(floatVector4.m_value[2]) || NAN((float)reference2))) goto LAB_006272ad;
  }
  if (!enableRef3) {
    return;
  }
  if ((floatVector4.m_value[3] == (float)reference3) &&
     (!NAN(floatVector4.m_value[3]) && !NAN((float)reference3))) {
    return;
  }
LAB_006272ad:
  local_1b0.m_log = testCtx->m_log;
  this_00 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"// ERROR: expected ");
  pcVar4 = "(";
  pcVar2 = "(";
  if (enableRef0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  std::ostream::operator<<(this_00,fVar5);
  pcVar3 = ")";
  pcVar2 = ")";
  if (enableRef0) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  std::operator<<((ostream *)this_00,", ");
  pcVar2 = "(";
  if (enableRef1) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  std::ostream::operator<<(this_00,(float)reference1);
  pcVar2 = ")";
  if (enableRef1) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  std::operator<<((ostream *)this_00,", ");
  pcVar2 = "(";
  if (enableRef2) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  std::ostream::operator<<(this_00,(float)reference2);
  pcVar2 = ")";
  if (enableRef2) {
    pcVar2 = "";
  }
  std::operator<<((ostream *)this_00,pcVar2);
  std::operator<<((ostream *)this_00,", ");
  if (enableRef3) {
    pcVar4 = "";
  }
  std::operator<<((ostream *)this_00,pcVar4);
  std::ostream::operator<<(this_00,(float)reference3);
  if (enableRef3) {
    pcVar3 = "";
  }
  std::operator<<((ostream *)this_00,pcVar3);
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
    tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid float value");
  }
  return;
}

Assistant:

void GetFloatVerifier::verifyInteger4Mask (tcu::TestContext& testCtx, GLenum name, GLint reference0, bool enableRef0, GLint reference1, bool enableRef1, GLint reference2, bool enableRef2, GLint reference3, bool enableRef3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[4]> floatVector4;
	glGetFloatv(name, floatVector4);

	if (!floatVector4.verifyValidity(testCtx))
		return;

	if ((enableRef0 && (floatVector4[0] != GLfloat(reference0))) ||
		(enableRef1 && (floatVector4[1] != GLfloat(reference1))) ||
		(enableRef2 && (floatVector4[2] != GLfloat(reference2))) ||
		(enableRef3 && (floatVector4[3] != GLfloat(reference3))))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< (enableRef0?"":"(") << GLfloat(reference0) << (enableRef0?"":")") << ", "
			<< (enableRef1?"":"(") << GLfloat(reference1) << (enableRef1?"":")") << ", "
			<< (enableRef2?"":"(") << GLfloat(reference2) << (enableRef2?"":")") << ", "
			<< (enableRef3?"":"(") << GLfloat(reference3) << (enableRef3?"":")") << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid float value");
	}
}